

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int allocateBtreePage(BtShared *pBt,MemPage **ppPage,Pgno *pPgno,Pgno nearby,u8 eMode)

{
  u8 uVar1;
  MemPage *pMVar2;
  Bitvec *p;
  bool bVar3;
  MemPage *pPage;
  u32 uVar4;
  Pgno PVar5;
  int iVar6;
  u32 uVar7;
  u32 uVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  uint uVar12;
  uint uVar13;
  u8 *puVar14;
  MemPage *pPage_00;
  ulong uVar15;
  MemPage *pPage_01;
  ulong uVar16;
  long in_FS_OFFSET;
  bool bVar17;
  uint local_6c;
  u8 eType;
  undefined7 uStack_47;
  MemPage *pTrunk;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pTrunk = (MemPage *)0x0;
  pMVar2 = pBt->pPage1;
  uVar12 = pBt->nPage;
  uVar4 = sqlite3Get4byte(pMVar2->aData + 0x24);
  if (uVar12 <= uVar4) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      iVar6 = sqlite3CorruptError(0x12db7);
      return iVar6;
    }
    goto LAB_0013c067;
  }
  if (uVar4 == 0) {
    uVar1 = pBt->bDoTruncate;
    iVar6 = sqlite3PagerWrite(pMVar2->pDbPage);
    if (iVar6 == 0) {
      uVar13 = pBt->nPage;
      uVar12 = uVar13 + 1;
      pBt->nPage = uVar12;
      if (uVar13 == (uint)sqlite3PendingByte / pBt->pageSize) {
        uVar12 = uVar13 + 2;
        pBt->nPage = uVar12;
      }
      uVar13 = (uint)(uVar1 == '\0');
      if ((pBt->autoVacuum == '\0') || (PVar5 = ptrmapPageno(pBt,uVar12), PVar5 != uVar12)) {
LAB_0013bf77:
        *(uint *)(pBt->pPage1->aData + 0x1c) =
             uVar12 >> 0x18 | (uVar12 & 0xff0000) >> 8 | (uVar12 & 0xff00) << 8 | uVar12 << 0x18;
        PVar5 = pBt->nPage;
        *pPgno = PVar5;
        iVar6 = btreeGetUnusedPage(pBt,PVar5,ppPage,uVar13);
        if (iVar6 == 0) {
          iVar6 = sqlite3PagerWrite((*ppPage)->pDbPage);
          if (iVar6 == 0) {
            pPage_01 = (MemPage *)0x0;
            pPage_00 = (MemPage *)0x0;
            iVar6 = 0;
          }
          else {
            releasePage(*ppPage);
            *ppPage = (MemPage *)0x0;
            pPage_01 = (MemPage *)0x0;
LAB_0013bfc6:
            pPage_00 = (MemPage *)0x0;
          }
LAB_0013c022:
          releasePage(pPage_01);
          releasePage(pPage_00);
        }
      }
      else {
        _eType = (MemPage *)0x0;
        iVar6 = btreeGetUnusedPage(pBt,uVar12,(MemPage **)&eType,uVar13);
        pMVar2 = _eType;
        if (iVar6 == 0) {
          iVar6 = sqlite3PagerWrite(_eType->pDbPage);
          releasePage(pMVar2);
          if (iVar6 == 0) {
            uVar10 = pBt->nPage;
            uVar12 = uVar10 + 1;
            pBt->nPage = uVar12;
            if (uVar10 == (uint)sqlite3PendingByte / pBt->pageSize) {
              uVar12 = uVar10 + 2;
              pBt->nPage = uVar12;
            }
            goto LAB_0013bf77;
          }
        }
      }
    }
  }
  else {
    if (eMode == '\x02') {
      bVar17 = true;
    }
    else if ((eMode == '\x01') && (nearby <= uVar12)) {
      _eType = (MemPage *)CONCAT71(uStack_47,0xaa);
      iVar6 = ptrmapGet(pBt,nearby,&eType,(Pgno *)0x0);
      bVar17 = eType == '\x02';
      if (iVar6 != 0) goto LAB_0013c032;
    }
    else {
      bVar17 = false;
    }
    iVar6 = sqlite3PagerWrite(pMVar2->pDbPage);
    if (iVar6 == 0) {
      uVar13 = uVar4 - 1;
      *(uint *)(pMVar2->aData + 0x24) =
           uVar13 >> 0x18 | (uVar13 & 0xff0000) >> 8 | (uVar13 & 0xff00) << 8 | uVar13 * 0x1000000;
      local_6c = 0;
      pPage_00 = (MemPage *)0x0;
LAB_0013baa3:
      if (pPage_00 == (MemPage *)0x0) {
        puVar14 = pMVar2->aData + 0x20;
      }
      else {
        puVar14 = pPage_00->aData;
      }
      uVar7 = sqlite3Get4byte(puVar14);
      if ((uVar12 < uVar7) || (uVar4 < local_6c)) {
        iVar6 = sqlite3CorruptError(0x12def);
LAB_0013bfd5:
        pPage_01 = (MemPage *)0x0;
        goto LAB_0013c022;
      }
      iVar6 = btreeGetUnusedPage(pBt,uVar7,&pTrunk,0);
      pPage_01 = pTrunk;
      if (iVar6 != 0) goto LAB_0013bfd5;
      puVar14 = pTrunk->aData;
      uVar8 = sqlite3Get4byte(puVar14 + 4);
      if ((bVar17) || (uVar8 != 0)) {
        if ((pBt->usableSize >> 2) - 2 < uVar8) {
          iVar6 = sqlite3CorruptError(0x12e0c);
          goto LAB_0013c022;
        }
        if (bVar17) {
          if ((uVar7 == nearby) || (eMode == '\x02' && uVar7 < nearby)) {
            *pPgno = uVar7;
            *ppPage = pPage_01;
            iVar6 = sqlite3PagerWrite(pPage_01->pDbPage);
            if (iVar6 != 0) goto LAB_0013c022;
            if (uVar8 == 0) {
              if (pPage_00 == (MemPage *)0x0) {
                *(undefined4 *)(pMVar2->aData + 0x20) = *(undefined4 *)pPage_01->aData;
              }
              else {
                iVar6 = sqlite3PagerWrite(pPage_00->pDbPage);
                if (iVar6 != 0) goto LAB_0013c022;
                *(undefined4 *)pPage_00->aData = *(undefined4 *)pPage_01->aData;
              }
            }
            else {
              _eType = (MemPage *)&DAT_aaaaaaaaaaaaaaaa;
              uVar7 = sqlite3Get4byte(pPage_01->aData + 8);
              if (uVar12 < uVar7) {
                iVar6 = sqlite3CorruptError(0x12e2e);
                goto LAB_0013c022;
              }
              iVar6 = btreeGetUnusedPage(pBt,uVar7,(MemPage **)&eType,0);
              pPage = _eType;
              if (iVar6 != 0) goto LAB_0013c022;
              iVar6 = sqlite3PagerWrite(_eType->pDbPage);
              if (iVar6 != 0) {
                releasePage(pPage);
                goto LAB_0013c022;
              }
              *(undefined4 *)pPage->aData = *(undefined4 *)pPage_01->aData;
              uVar13 = uVar8 - 1;
              *(uint *)(pPage->aData + 4) =
                   uVar13 >> 0x18 | (uVar13 & 0xff0000) >> 8 | (uVar13 & 0xff00) << 8 |
                   uVar13 * 0x1000000;
              memcpy(pPage->aData + 8,pPage_01->aData + 0xc,(ulong)(uVar8 * 4 - 4));
              releasePage(pPage);
              uVar13 = uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 |
                       uVar7 << 0x18;
              if (pPage_00 != (MemPage *)0x0) {
                iVar6 = sqlite3PagerWrite(pPage_00->pDbPage);
                if (iVar6 == 0) {
                  *(uint *)pPage_00->aData = uVar13;
                  goto LAB_0013bb4e;
                }
                goto LAB_0013c022;
              }
              *(uint *)(pMVar2->aData + 0x20) = uVar13;
            }
            goto LAB_0013bb4e;
          }
        }
        if (uVar8 == 0) {
          iVar6 = 0;
        }
        else {
          uVar13 = 0;
          if (nearby != 0) {
            if (eMode == '\x02') {
              uVar10 = 8;
              for (uVar16 = 0; uVar13 = 0, uVar8 != uVar16; uVar16 = uVar16 + 1) {
                uVar7 = sqlite3Get4byte(puVar14 + uVar10);
                if (uVar7 <= nearby) {
                  uVar13 = (uint)uVar16;
                  break;
                }
                uVar10 = uVar10 + 4;
              }
            }
            else {
              uVar7 = sqlite3Get4byte(puVar14 + 8);
              iVar11 = uVar7 - nearby;
              iVar6 = -iVar11;
              if (-1 < iVar11) {
                iVar6 = iVar11;
              }
              uVar15 = 0;
              uVar10 = 0xc;
              for (uVar16 = 1; uVar13 = (uint)uVar15, uVar8 != uVar16; uVar16 = uVar16 + 1) {
                uVar7 = sqlite3Get4byte(puVar14 + uVar10);
                iVar9 = uVar7 - nearby;
                iVar11 = -iVar9;
                if (-1 < iVar9) {
                  iVar11 = iVar9;
                }
                if (iVar11 < iVar6) {
                  uVar15 = uVar16 & 0xffffffff;
                  iVar6 = iVar11;
                }
                uVar10 = uVar10 + 4;
              }
            }
          }
          uVar7 = sqlite3Get4byte(puVar14 + (uVar13 * 4 + 8));
          if ((uVar12 < uVar7) || (uVar7 < 2)) {
            iVar6 = sqlite3CorruptError(0x12e6f);
            goto LAB_0013c022;
          }
          if (((uVar7 == nearby) || (eMode == '\x02' && uVar7 < nearby)) || (!bVar17)) {
            *pPgno = uVar7;
            iVar6 = sqlite3PagerWrite(pPage_01->pDbPage);
            if (iVar6 != 0) goto LAB_0013c022;
            uVar10 = uVar8 - 1;
            if (uVar13 < uVar10) {
              *(undefined4 *)(puVar14 + (uVar13 * 4 + 8)) =
                   *(undefined4 *)(puVar14 + (uVar8 * 4 + 4));
            }
            *(uint *)(puVar14 + 4) =
                 uVar10 >> 0x18 | (uVar10 & 0xff0000) >> 8 | (uVar10 & 0xff00) << 8 |
                 uVar10 * 0x1000000;
            uVar13 = *pPgno;
            p = pBt->pHasContent;
            uVar10 = 1;
            if ((p != (Bitvec *)0x0) && (uVar10 = 0, uVar13 <= p->iSize)) {
              iVar6 = sqlite3BitvecTestNotNull(p,uVar13);
              uVar10 = (uint)(iVar6 == 0);
            }
            iVar6 = btreeGetUnusedPage(pBt,uVar13,ppPage,uVar10);
            if ((iVar6 == 0) &&
               (iVar11 = sqlite3PagerWrite((*ppPage)->pDbPage), iVar6 = 0, iVar11 != 0)) {
              releasePage(*ppPage);
              *ppPage = (MemPage *)0x0;
              iVar6 = iVar11;
            }
            bVar17 = false;
          }
          else {
            iVar6 = 0;
            bVar17 = true;
          }
        }
      }
      else {
        iVar6 = sqlite3PagerWrite(pPage_01->pDbPage);
        if (iVar6 != 0) goto LAB_0013c022;
        *pPgno = uVar7;
        *(undefined4 *)(pMVar2->aData + 0x20) = *(undefined4 *)pPage_01->aData;
        *ppPage = pPage_01;
LAB_0013bb4e:
        pTrunk = (MemPage *)0x0;
        pPage_01 = (MemPage *)0x0;
        bVar17 = false;
        iVar6 = 0;
      }
      local_6c = local_6c + 1;
      releasePage(pPage_00);
      bVar3 = !bVar17;
      bVar17 = true;
      pPage_00 = pPage_01;
      if (bVar3) goto LAB_0013bfc6;
      goto LAB_0013baa3;
    }
  }
LAB_0013c032:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return iVar6;
  }
LAB_0013c067:
  __stack_chk_fail();
}

Assistant:

static int allocateBtreePage(
  BtShared *pBt,         /* The btree */
  MemPage **ppPage,      /* Store pointer to the allocated page here */
  Pgno *pPgno,           /* Store the page number here */
  Pgno nearby,           /* Search for a page near this one */
  u8 eMode               /* BTALLOC_EXACT, BTALLOC_LT, or BTALLOC_ANY */
){
  MemPage *pPage1;
  int rc;
  u32 n;     /* Number of pages on the freelist */
  u32 k;     /* Number of leaves on the trunk of the freelist */
  MemPage *pTrunk = 0;
  MemPage *pPrevTrunk = 0;
  Pgno mxPage;     /* Total size of the database file */

  assert( sqlite3_mutex_held(pBt->mutex) );
  assert( eMode==BTALLOC_ANY || (nearby>0 && IfNotOmitAV(pBt->autoVacuum)) );
  pPage1 = pBt->pPage1;
  mxPage = btreePagecount(pBt);
  /* EVIDENCE-OF: R-21003-45125 The 4-byte big-endian integer at offset 36
  ** stores the total number of pages on the freelist. */
  n = get4byte(&pPage1->aData[36]);
  testcase( n==mxPage-1 );
  if( n>=mxPage ){
    return SQLITE_CORRUPT_BKPT;
  }
  if( n>0 ){
    /* There are pages on the freelist.  Reuse one of those pages. */
    Pgno iTrunk;
    u8 searchList = 0; /* If the free-list must be searched for 'nearby' */
    u32 nSearch = 0;   /* Count of the number of search attempts */

    /* If eMode==BTALLOC_EXACT and a query of the pointer-map
    ** shows that the page 'nearby' is somewhere on the free-list, then
    ** the entire-list will be searched for that page.
    */
#ifndef SQLITE_OMIT_AUTOVACUUM
    if( eMode==BTALLOC_EXACT ){
      if( nearby<=mxPage ){
        u8 eType;
        assert( nearby>0 );
        assert( pBt->autoVacuum );
        rc = ptrmapGet(pBt, nearby, &eType, 0);
        if( rc ) return rc;
        if( eType==PTRMAP_FREEPAGE ){
          searchList = 1;
        }
      }
    }else if( eMode==BTALLOC_LE ){
      searchList = 1;
    }
#endif

    /* Decrement the free-list count by 1. Set iTrunk to the index of the
    ** first free-list trunk page. iPrevTrunk is initially 1.
    */
    rc = sqlite3PagerWrite(pPage1->pDbPage);
    if( rc ) return rc;
    put4byte(&pPage1->aData[36], n-1);

    /* The code within this loop is run only once if the 'searchList' variable
    ** is not true. Otherwise, it runs once for each trunk-page on the
    ** free-list until the page 'nearby' is located (eMode==BTALLOC_EXACT)
    ** or until a page less than 'nearby' is located (eMode==BTALLOC_LT)
    */
    do {
      pPrevTrunk = pTrunk;
      if( pPrevTrunk ){
        /* EVIDENCE-OF: R-01506-11053 The first integer on a freelist trunk page
        ** is the page number of the next freelist trunk page in the list or
        ** zero if this is the last freelist trunk page. */
        iTrunk = get4byte(&pPrevTrunk->aData[0]);
      }else{
        /* EVIDENCE-OF: R-59841-13798 The 4-byte big-endian integer at offset 32
        ** stores the page number of the first page of the freelist, or zero if
        ** the freelist is empty. */
        iTrunk = get4byte(&pPage1->aData[32]);
      }
      testcase( iTrunk==mxPage );
      if( iTrunk>mxPage || nSearch++ > n ){
        rc = SQLITE_CORRUPT_PGNO(pPrevTrunk ? pPrevTrunk->pgno : 1);
      }else{
        rc = btreeGetUnusedPage(pBt, iTrunk, &pTrunk, 0);
      }
      if( rc ){
        pTrunk = 0;
        goto end_allocate_page;
      }
      assert( pTrunk!=0 );
      assert( pTrunk->aData!=0 );
      /* EVIDENCE-OF: R-13523-04394 The second integer on a freelist trunk page
      ** is the number of leaf page pointers to follow. */
      k = get4byte(&pTrunk->aData[4]);
      if( k==0 && !searchList ){
        /* The trunk has no leaves and the list is not being searched.
        ** So extract the trunk page itself and use it as the newly
        ** allocated page */
        assert( pPrevTrunk==0 );
        rc = sqlite3PagerWrite(pTrunk->pDbPage);
        if( rc ){
          goto end_allocate_page;
        }
        *pPgno = iTrunk;
        memcpy(&pPage1->aData[32], &pTrunk->aData[0], 4);
        *ppPage = pTrunk;
        pTrunk = 0;
        TRACE(("ALLOCATE: %u trunk - %u free pages left\n", *pPgno, n-1));
      }else if( k>(u32)(pBt->usableSize/4 - 2) ){
        /* Value of k is out of range.  Database corruption */
        rc = SQLITE_CORRUPT_PGNO(iTrunk);
        goto end_allocate_page;
#ifndef SQLITE_OMIT_AUTOVACUUM
      }else if( searchList
            && (nearby==iTrunk || (iTrunk<nearby && eMode==BTALLOC_LE))
      ){
        /* The list is being searched and this trunk page is the page
        ** to allocate, regardless of whether it has leaves.
        */
        *pPgno = iTrunk;
        *ppPage = pTrunk;
        searchList = 0;
        rc = sqlite3PagerWrite(pTrunk->pDbPage);
        if( rc ){
          goto end_allocate_page;
        }
        if( k==0 ){
          if( !pPrevTrunk ){
            memcpy(&pPage1->aData[32], &pTrunk->aData[0], 4);
          }else{
            rc = sqlite3PagerWrite(pPrevTrunk->pDbPage);
            if( rc!=SQLITE_OK ){
              goto end_allocate_page;
            }
            memcpy(&pPrevTrunk->aData[0], &pTrunk->aData[0], 4);
          }
        }else{
          /* The trunk page is required by the caller but it contains
          ** pointers to free-list leaves. The first leaf becomes a trunk
          ** page in this case.
          */
          MemPage *pNewTrunk;
          Pgno iNewTrunk = get4byte(&pTrunk->aData[8]);
          if( iNewTrunk>mxPage ){
            rc = SQLITE_CORRUPT_PGNO(iTrunk);
            goto end_allocate_page;
          }
          testcase( iNewTrunk==mxPage );
          rc = btreeGetUnusedPage(pBt, iNewTrunk, &pNewTrunk, 0);
          if( rc!=SQLITE_OK ){
            goto end_allocate_page;
          }
          rc = sqlite3PagerWrite(pNewTrunk->pDbPage);
          if( rc!=SQLITE_OK ){
            releasePage(pNewTrunk);
            goto end_allocate_page;
          }
          memcpy(&pNewTrunk->aData[0], &pTrunk->aData[0], 4);
          put4byte(&pNewTrunk->aData[4], k-1);
          memcpy(&pNewTrunk->aData[8], &pTrunk->aData[12], (k-1)*4);
          releasePage(pNewTrunk);
          if( !pPrevTrunk ){
            assert( sqlite3PagerIswriteable(pPage1->pDbPage) );
            put4byte(&pPage1->aData[32], iNewTrunk);
          }else{
            rc = sqlite3PagerWrite(pPrevTrunk->pDbPage);
            if( rc ){
              goto end_allocate_page;
            }
            put4byte(&pPrevTrunk->aData[0], iNewTrunk);
          }
        }
        pTrunk = 0;
        TRACE(("ALLOCATE: %u trunk - %u free pages left\n", *pPgno, n-1));
#endif
      }else if( k>0 ){
        /* Extract a leaf from the trunk */
        u32 closest;
        Pgno iPage;
        unsigned char *aData = pTrunk->aData;
        if( nearby>0 ){
          u32 i;
          closest = 0;
          if( eMode==BTALLOC_LE ){
            for(i=0; i<k; i++){
              iPage = get4byte(&aData[8+i*4]);
              if( iPage<=nearby ){
                closest = i;
                break;
              }
            }
          }else{
            int dist;
            dist = sqlite3AbsInt32(get4byte(&aData[8]) - nearby);
            for(i=1; i<k; i++){
              int d2 = sqlite3AbsInt32(get4byte(&aData[8+i*4]) - nearby);
              if( d2<dist ){
                closest = i;
                dist = d2;
              }
            }
          }
        }else{
          closest = 0;
        }

        iPage = get4byte(&aData[8+closest*4]);
        testcase( iPage==mxPage );
        if( iPage>mxPage || iPage<2 ){
          rc = SQLITE_CORRUPT_PGNO(iTrunk);
          goto end_allocate_page;
        }
        testcase( iPage==mxPage );
        if( !searchList
         || (iPage==nearby || (iPage<nearby && eMode==BTALLOC_LE))
        ){
          int noContent;
          *pPgno = iPage;
          TRACE(("ALLOCATE: %u was leaf %u of %u on trunk %u"
                 ": %u more free pages\n",
                 *pPgno, closest+1, k, pTrunk->pgno, n-1));
          rc = sqlite3PagerWrite(pTrunk->pDbPage);
          if( rc ) goto end_allocate_page;
          if( closest<k-1 ){
            memcpy(&aData[8+closest*4], &aData[4+k*4], 4);
          }
          put4byte(&aData[4], k-1);
          noContent = !btreeGetHasContent(pBt, *pPgno)? PAGER_GET_NOCONTENT : 0;
          rc = btreeGetUnusedPage(pBt, *pPgno, ppPage, noContent);
          if( rc==SQLITE_OK ){
            rc = sqlite3PagerWrite((*ppPage)->pDbPage);
            if( rc!=SQLITE_OK ){
              releasePage(*ppPage);
              *ppPage = 0;
            }
          }
          searchList = 0;
        }
      }
      releasePage(pPrevTrunk);
      pPrevTrunk = 0;
    }while( searchList );
  }else{
    /* There are no pages on the freelist, so append a new page to the
    ** database image.
    **
    ** Normally, new pages allocated by this block can be requested from the
    ** pager layer with the 'no-content' flag set. This prevents the pager
    ** from trying to read the pages content from disk. However, if the
    ** current transaction has already run one or more incremental-vacuum
    ** steps, then the page we are about to allocate may contain content
    ** that is required in the event of a rollback. In this case, do
    ** not set the no-content flag. This causes the pager to load and journal
    ** the current page content before overwriting it.
    **
    ** Note that the pager will not actually attempt to load or journal
    ** content for any page that really does lie past the end of the database
    ** file on disk. So the effects of disabling the no-content optimization
    ** here are confined to those pages that lie between the end of the
    ** database image and the end of the database file.
    */
    int bNoContent = (0==IfNotOmitAV(pBt->bDoTruncate))? PAGER_GET_NOCONTENT:0;

    rc = sqlite3PagerWrite(pBt->pPage1->pDbPage);
    if( rc ) return rc;
    pBt->nPage++;
    if( pBt->nPage==PENDING_BYTE_PAGE(pBt) ) pBt->nPage++;

#ifndef SQLITE_OMIT_AUTOVACUUM
    if( pBt->autoVacuum && PTRMAP_ISPAGE(pBt, pBt->nPage) ){
      /* If *pPgno refers to a pointer-map page, allocate two new pages
      ** at the end of the file instead of one. The first allocated page
      ** becomes a new pointer-map page, the second is used by the caller.
      */
      MemPage *pPg = 0;
      TRACE(("ALLOCATE: %u from end of file (pointer-map page)\n", pBt->nPage));
      assert( pBt->nPage!=PENDING_BYTE_PAGE(pBt) );
      rc = btreeGetUnusedPage(pBt, pBt->nPage, &pPg, bNoContent);
      if( rc==SQLITE_OK ){
        rc = sqlite3PagerWrite(pPg->pDbPage);
        releasePage(pPg);
      }
      if( rc ) return rc;
      pBt->nPage++;
      if( pBt->nPage==PENDING_BYTE_PAGE(pBt) ){ pBt->nPage++; }
    }
#endif
    put4byte(28 + (u8*)pBt->pPage1->aData, pBt->nPage);
    *pPgno = pBt->nPage;

    assert( *pPgno!=PENDING_BYTE_PAGE(pBt) );
    rc = btreeGetUnusedPage(pBt, *pPgno, ppPage, bNoContent);
    if( rc ) return rc;
    rc = sqlite3PagerWrite((*ppPage)->pDbPage);
    if( rc!=SQLITE_OK ){
      releasePage(*ppPage);
      *ppPage = 0;
    }
    TRACE(("ALLOCATE: %u from end of file\n", *pPgno));
  }

  assert( CORRUPT_DB || *pPgno!=PENDING_BYTE_PAGE(pBt) );

end_allocate_page:
  releasePage(pTrunk);
  releasePage(pPrevTrunk);
  assert( rc!=SQLITE_OK || sqlite3PagerPageRefcount((*ppPage)->pDbPage)<=1 );
  assert( rc!=SQLITE_OK || (*ppPage)->isInit==0 );
  return rc;
}